

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderLocalName(xmlTextReaderPtr reader)

{
  xmlNsPtr ns;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      ns = (xmlNsPtr)reader->node;
    }
    else {
      ns = (xmlNsPtr)reader->curnode;
    }
    if (ns->type == XML_NAMESPACE_DECL) {
      if (ns->prefix == (xmlChar *)0x0) {
        reader_local = (xmlTextReaderPtr)readerStrdup(reader,"xmlns");
      }
      else {
        reader_local = (xmlTextReaderPtr)readerStrdup(reader,ns->prefix);
      }
    }
    else if ((ns->type == XML_ELEMENT_NODE) || (ns->type == XML_ATTRIBUTE_NODE)) {
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,ns->href);
    }
    else {
      reader_local = (xmlTextReaderPtr)xmlTextReaderName(reader);
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderLocalName(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    if (node->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) node;
	if (ns->prefix == NULL)
	    return(readerStrdup(reader, BAD_CAST "xmlns"));
	else
	    return(readerStrdup(reader, ns->prefix));
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE))
	return(xmlTextReaderName(reader));
    return(readerStrdup(reader, node->name));
}